

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11wm.cpp
# Opt level: O0

void __thiscall rw::X11WM::change_window_state(X11WM *this,Window *window,Atom operation,Atom state)

{
  int iVar1;
  ostream *this_00;
  long mask;
  XEvent event;
  Atom state_local;
  Atom operation_local;
  Window *window_local;
  X11WM *this_local;
  
  mask._0_4_ = 0x21;
  event.pad[0] = 0;
  event.xany.serial._0_4_ = 1;
  event.xany.window = this->_NET_WM_STATE;
  event.xany.display = (Display *)(long)window->window_id;
  event.xfocus.mode = 0x20;
  event.xselectionrequest.property = 0;
  event.xconfigure.above = 0;
  event.pad[10] = 0;
  event.xselectionrequest.selection = operation;
  event.xselectionrequest.target = state;
  event.pad[0x17] = state;
  state_local = operation;
  operation_local = (Atom)window;
  window_local = (Window *)this;
  iVar1 = XSendEvent(this->display,this->root_window,0,0x180000,&mask);
  if (iVar1 == 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"Could not change window state.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    exit(2);
  }
  return;
}

Assistant:

void X11WM::change_window_state(const Window *window, ::Atom operation,
                                    ::Atom state)
    {
        XEvent event;
        long mask = SubstructureRedirectMask | SubstructureNotifyMask;

        event.xclient.type = ClientMessage;
        event.xclient.serial = 0;
        event.xclient.send_event = True;
        event.xclient.message_type = _NET_WM_STATE;
        event.xclient.window = window->window_id;
        event.xclient.format = 32;
        event.xclient.data.l[0] = (unsigned long) operation;
        event.xclient.data.l[1] = (unsigned long) state;
        event.xclient.data.l[2] = (unsigned long) 0;
        event.xclient.data.l[3] = (unsigned long) 0;
        event.xclient.data.l[4] = (unsigned long) 0;

        if (!XSendEvent(display, root_window, False, mask, &event)) {
            cerr << "Could not change window state." << endl;
            exit(2);
        }
    }